

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result wabt::ValidateScript(Script *script,Errors *errors,ValidateOptions *options)

{
  Command *base;
  Action *action;
  long lVar1;
  Errors *errors_00;
  ModuleCommand *pMVar2;
  AssertReturnCommand *pAVar3;
  ActionCommandBase<(wabt::CommandType)1> *pAVar4;
  undefined8 *puVar5;
  char *in_R8;
  unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_> *command;
  undefined8 *puVar6;
  long lVar7;
  ActionResult AVar8;
  ScriptValidator validator;
  Validator module_validator;
  Enum local_300;
  Kind local_2fc;
  undefined8 *local_2f8;
  anon_union_8_2_516a9242_for_ActionResult_2 local_2f0;
  ScriptValidator local_2e8;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  Validator local_2a8;
  
  local_2e8.result_.enum_ = Ok;
  puVar6 = *(undefined8 **)script;
  puVar5 = *(undefined8 **)&script->field_0x8;
  local_2f8 = puVar5;
  local_2e8.options_ = options;
  local_2e8.errors_ = errors;
  local_2e8.script_ = script;
  do {
    errors_00 = local_2e8.errors_;
    if (puVar6 == puVar5) {
      return (Result)local_2e8.result_.enum_;
    }
    base = (Command *)*puVar6;
    switch(*(undefined4 *)(base + 8)) {
    case 0:
      pMVar2 = cast<wabt::ModuleCommand,wabt::Command>(base);
      anon_unknown_4::Validator::Validator
                (&local_2a8,errors_00,(Module *)(pMVar2 + 0x10),local_2e8.options_);
      anon_unknown_4::Validator::CheckModule(&local_2a8);
      anon_unknown_4::Validator::~Validator(&local_2a8);
      break;
    case 1:
      pAVar4 = cast<wabt::ActionCommandBase<(wabt::CommandType)1>,wabt::Command>(base);
      goto LAB_001598b2;
    case 7:
      pAVar3 = cast<wabt::AssertReturnCommand,wabt::Command>(base);
      action = *(Action **)(pAVar3 + 0x10);
      AVar8 = anon_unknown_4::ScriptValidator::CheckAction(&local_2e8,action);
      local_2f0 = AVar8.field_1;
      local_2fc = AVar8.kind;
      local_2a8.errors_ = (Errors *)0x0;
      local_2a8.super_Delegate._vptr_Delegate = (_func_int **)0x0;
      local_2a8.options_ = (ValidateOptions *)0x0;
      lVar1 = *(long *)(pAVar3 + 0x20);
      for (lVar7 = *(long *)(pAVar3 + 0x18); puVar5 = local_2f8, lVar7 != lVar1;
          lVar7 = lVar7 + 0x48) {
        local_2c8 = CONCAT44(local_2c8._4_4_,*(undefined4 *)(lVar7 + 0x20));
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
                  ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_2a8,(Type *)&local_2c8)
        ;
      }
      if (local_2fc == Types) {
        anon_unknown_4::ScriptValidator::CheckResultTypes
                  (&local_2e8,(Location *)(action + 8),(TypeVector *)&local_2a8,local_2f0.types,
                   in_R8);
        puVar5 = local_2f8;
      }
      else if (local_2fc == Type) {
        local_300 = (Enum)local_2f0.type.enum_;
        local_2c8 = 0;
        uStack_2c0 = 0;
        local_2b8 = 0;
        std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
                  ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_2c8,&local_300,&local_2fc
                  );
        anon_unknown_4::ScriptValidator::CheckResultTypes
                  (&local_2e8,(Location *)(action + 8),(TypeVector *)&local_2a8,
                   (TypeVector *)&local_2c8,in_R8);
        std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
                  ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_2c8);
      }
      std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
                ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_2a8);
      break;
    case 8:
      pAVar4 = (ActionCommandBase<(wabt::CommandType)1> *)
               cast<wabt::AssertTrapCommandBase<(wabt::CommandType)8>,wabt::Command>(base);
      goto LAB_001598b2;
    case 9:
      pAVar4 = (ActionCommandBase<(wabt::CommandType)1> *)
               cast<wabt::AssertTrapCommandBase<(wabt::CommandType)9>,wabt::Command>(base);
LAB_001598b2:
      anon_unknown_4::ScriptValidator::CheckAction(&local_2e8,*(Action **)(pAVar4 + 0x10));
    }
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

Result ValidateScript(const Script* script,
                      Errors* errors,
                      const ValidateOptions& options) {
  ScriptValidator validator(errors, script, options);

  return validator.CheckScript();
}